

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_convolver_test_utils.cpp
# Opt level: O2

void write_array(string *base,string *name,size_t n,float *x)

{
  bool bVar1;
  char cVar2;
  ostream *poVar3;
  size_t i;
  size_t sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_248;
  ofstream out;
  
  bVar1 = std::operator!=(base,"");
  if (bVar1) {
    std::operator+(&bStack_248,base,name);
    std::ofstream::ofstream(&out,(string *)&bStack_248,_S_out);
    std::__cxx11::string::~string((string *)&bStack_248);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      __assert_fail("out.is_open()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/tests/block_convolver_test_utils.cpp"
                    ,0x43,
                    "void write_array(const std::string &, const std::string &, size_t, float *)");
    }
    for (sVar4 = 0; n != sVar4; sVar4 = sVar4 + 1) {
      poVar3 = (ostream *)std::ostream::operator<<(&out,x[sVar4]);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::ofstream::~ofstream(&out);
  }
  return;
}

Assistant:

void write_array(const std::string &base, const std::string &name, size_t n,
                 float *x) {
  if (base != "") {
    std::ofstream out(base + name);
    assert(out.is_open());
    for (size_t i = 0; i < n; i++) out << x[i] << std::endl;
  }
}